

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Layer *pLVar5;
  float fVar6;
  float fVar7;
  uint _elempack;
  int iVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined1 uVar13;
  _func_int *p_Var14;
  undefined4 *puVar15;
  long lVar16;
  ulong uVar17;
  void *pvVar18;
  _func_int **pp_Var19;
  int g_2;
  uint uVar20;
  uint uVar21;
  undefined1 *puVar22;
  void *pvVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  _Vector_base<float,_std::allocator<float>_> *p_Var31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [16];
  long lVar35;
  float *pfVar36;
  long lVar37;
  int remain_1;
  int iVar38;
  long lVar39;
  int iVar40;
  int k;
  ulong uVar41;
  _func_int **pp_Var42;
  int iVar43;
  uint uVar44;
  void *pvVar45;
  int g;
  ulong uVar46;
  void *pvVar47;
  ulong uVar48;
  long lVar49;
  void *pvVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined4 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  __m128 pos_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar111;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar109;
  float fVar110;
  undefined1 auVar108 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar135;
  float fVar136;
  __m128 max;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar137;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  v4sf one;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  __m128 pos;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  ulong local_338;
  float *local_330;
  byte local_310;
  byte local_300;
  long local_2f8;
  Mat local_2d8;
  _func_int **local_288;
  size_type local_280;
  ulong local_278;
  void *local_270;
  float top_rescale;
  int iStack_264;
  Allocator *pAStack_260;
  Allocator *pAStack_258;
  int iStack_250;
  undefined4 uStack_24c;
  Allocator *local_248;
  int iStack_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  undefined4 uStack_22c;
  size_t local_228;
  Option opt_q;
  float scale_out;
  undefined4 uStack_1ac;
  int *local_1a8;
  Allocator *local_1a0;
  int local_198;
  long *local_190;
  bool local_188;
  bool bStack_187;
  bool bStack_186;
  bool bStack_185;
  bool bStack_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int iStack_180;
  bool bStack_17c;
  bool bStack_17b;
  bool bStack_17a;
  bool bStack_179;
  int local_178;
  ulong local_170;
  Mat local_168;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
  p_Var14 = pp_Var42[-3];
  iVar43 = *(int *)(&this->field_0xd4 + (long)p_Var14);
  iVar25 = *(int *)(&this->field_0xd8 + (long)p_Var14);
  iVar24 = *(int *)(&this->field_0xdc + (long)p_Var14);
  iVar38 = *(int *)(&this->field_0xe0 + (long)p_Var14);
  piVar3 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    iVar26 = local_168.elempack * local_168.c;
    iVar40 = *(int *)(&this->field_0x108 + (long)pp_Var42[-3]);
    local_2d8.cstep = 0;
    local_2d8.data = (undefined4 *)0x0;
    local_2d8.refcount._0_4_ = 0;
    local_2d8.refcount._4_4_ = 0;
    local_2d8.elemsize = 0;
    local_2d8.elempack = 0;
    local_2d8.allocator = (Allocator *)0x0;
    local_2d8.dims = 0;
    local_2d8.w = 0;
    local_2d8.h = 0;
    local_2d8.d = 0;
    local_2d8.c = 0;
    lVar32 = 0;
    Mat::create(&local_2d8,iVar26,4,(Allocator *)0x0);
    iVar26 = iVar26 / iVar40;
    pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
    puVar15 = (undefined4 *)local_2d8.data;
    if (iVar26 < 1) {
      iVar26 = 0;
    }
    for (; lVar32 < *(int *)(&this->field_0x108 + (long)pp_Var42[-3]); lVar32 = lVar32 + 1) {
      uVar55 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var42[-3]) + lVar32 * 4);
      iVar40 = iVar26;
      while (bVar51 = iVar40 != 0, iVar40 = iVar40 + -1, bVar51) {
        *puVar15 = uVar55;
        puVar15 = puVar15 + 1;
      }
    }
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,&local_2d8,&opt_q);
    piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_2d8.allocator == (Allocator *)0x0) {
          free(local_2d8.data);
        }
        else {
          (*(local_2d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
  }
  local_2d8.cstep = 0;
  local_2d8.data = (void *)0x0;
  local_2d8.refcount._0_4_ = 0;
  local_2d8.refcount._4_4_ = 0;
  local_2d8.elemsize = 0;
  local_2d8.elempack = 0;
  local_2d8.allocator = (Allocator *)0x0;
  local_2d8.dims = 0;
  local_2d8.w = 0;
  local_2d8.h = 0;
  local_2d8.d = 0;
  local_2d8.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var42[-3]),&local_168,
             &local_2d8,opt);
  iVar27 = local_2d8.c;
  iVar8 = local_2d8.w;
  iVar26 = local_2d8.elempack;
  iVar40 = -100;
  if ((local_2d8.data == (void *)0x0) || (local_2d8.cstep * (long)local_2d8.c == 0))
  goto LAB_003a83ef;
  p_Var14 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar24 = (~((iVar43 + -1) * iVar24) + local_2d8.w) / *(int *)(&this->field_0xe4 + (long)p_Var14);
  iVar43 = (~((iVar25 + -1) * iVar38) + local_2d8.h) / *(int *)(&this->field_0xe8 + (long)p_Var14);
  iVar25 = iVar24 + 1;
  iVar38 = iVar43 + 1;
  uVar20 = local_2d8.elempack * local_2d8.c;
  uVar44 = 8;
  if ((uVar20 == *(uint *)(&this->field_0x108 + (long)p_Var14)) &&
     (uVar20 == *(uint *)(&this->field_0xd0 + (long)p_Var14))) {
    if (opt->use_packing_layout == false) {
      uVar44 = 1;
    }
    if ((uVar20 & 7) != 0) {
      uVar44 = 1;
    }
    iVar2 = *(int *)(&this->field_0x10c + (long)p_Var14);
    uVar21 = uVar44 * 4;
    if (100 < iVar2) {
      uVar21 = uVar44;
    }
    Mat::create(top_blob,iVar25,iVar38,(int)uVar20 / (int)uVar44,(ulong)uVar21,uVar44,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_003a83ef;
    iVar40 = 0;
    if (iVar26 == 1) {
      pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var14 = pp_Var42[-3];
      iVar25 = *(int *)(&this->field_0xd8 + (long)p_Var14);
      if (iVar25 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var14) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var14) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var14) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var14) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var14) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var14) < 2)))) {
          if (iVar2 < 0x65) {
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            for (lVar32 = 0; p_Var14 = pp_Var42[-3],
                lVar32 < *(int *)(&this->field_0x108 + (long)p_Var14); lVar32 = lVar32 + 1) {
              _top_rescale = (void *)CONCAT44(iStack_264,
                                              1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                         (long)p_Var14) + lVar32 * 4
                                                               ) *
                                                    *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var14) + lVar32 * 4)
                                                    ));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar43 = top_blob->w;
            iVar25 = top_blob->h;
            pvVar4 = (this->weight_data_tm).data;
            lVar32 = *(long *)(&this->field_0x1b0 + (long)p_Var14);
            iVar24 = top_blob->d;
            local_270 = top_blob->data;
            local_278 = top_blob->elemsize;
            lVar49 = top_blob->cstep * local_278;
            lVar35 = (long)iVar25 * (long)iVar43;
            local_280 = local_278 * lVar35 + 0xf & 0xfffffffffffffff0;
            local_288 = (_func_int **)(local_2d8.elemsize * local_2d8.cstep);
            iVar38 = 0;
            if (0 < iVar25) {
              iVar38 = iVar25;
            }
            iVar25 = top_blob->dims;
            uVar44 = top_blob->c;
            if (top_blob->c < 1) {
              uVar44 = 0;
            }
            pvVar23 = local_270;
            for (uVar48 = 0; uVar48 != uVar44; uVar48 = uVar48 + 1) {
              iVar40 = (int)(local_280 / local_278);
              if (iVar25 == 4) {
                iVar40 = (int)lVar35;
              }
              if (lVar32 == 0) {
                uVar55 = 0;
              }
              else {
                uVar55 = *(undefined4 *)(lVar32 + uVar48 * 4);
              }
              fVar53 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar48];
              iVar40 = iVar40 * iVar24;
              if (iVar40 < 1) {
                iVar40 = 0;
              }
              for (lVar39 = 0; iVar40 != (int)lVar39; lVar39 = lVar39 + 1) {
                *(undefined4 *)((long)pvVar23 + lVar39 * 4) = uVar55;
              }
              lVar37 = uVar48 * 9;
              pvVar45 = (void *)((long)local_288 * uVar48 + (long)local_2d8.data);
              lVar39 = (long)local_2d8.w + (long)pvVar45;
              pvVar47 = (void *)((long)local_2d8.w * 2 + (long)pvVar45);
              pvVar50 = (void *)(lVar49 * uVar48 + (long)local_270);
              for (iVar40 = 0; iVar40 != iVar38; iVar40 = iVar40 + 1) {
                lVar16 = 0;
                pvVar18 = pvVar50;
                for (iVar26 = iVar43; 0 < iVar26; iVar26 = iVar26 + -1) {
                  *(float *)((long)pvVar50 + lVar16 * 4) =
                       fVar53 * (float)((int)*(char *)((long)pvVar4 + lVar37 + 8) *
                                        (int)*(char *)((long)pvVar47 + lVar16 + 2) +
                                        (int)*(char *)((long)pvVar4 + lVar37 + 7) *
                                        (int)*(char *)((long)pvVar47 + lVar16 + 1) +
                                       (int)*(char *)((long)pvVar4 + lVar37 + 6) *
                                       (int)*(char *)((long)pvVar47 + lVar16) +
                                       (int)*(char *)((long)pvVar4 + lVar37 + 5) *
                                       (int)*(char *)(lVar39 + 2 + lVar16) +
                                       (int)*(char *)((long)pvVar4 + lVar37 + 4) *
                                       (int)*(char *)(lVar39 + 1 + lVar16) +
                                       (int)*(char *)((long)pvVar4 + lVar37 + 3) *
                                       (int)*(char *)(lVar39 + lVar16) +
                                       (int)*(char *)((long)pvVar4 + lVar37 + 2) *
                                       (int)*(char *)((long)pvVar45 + lVar16 + 2) +
                                       (int)*(char *)((long)pvVar4 + lVar37 + 1) *
                                       (int)*(char *)((long)pvVar45 + lVar16 + 1) +
                                       (int)*(char *)((long)pvVar4 + lVar37) *
                                       (int)*(char *)((long)pvVar45 + lVar16)) +
                       *(float *)((long)pvVar50 + lVar16 * 4);
                  pvVar18 = (void *)((long)pvVar18 + 4);
                  lVar16 = lVar16 + 1;
                }
                pvVar45 = (void *)((long)pvVar45 + lVar16 + 2);
                lVar39 = lVar39 + lVar16 + 2;
                pvVar47 = (void *)((long)pvVar47 + lVar16 + 2);
                pvVar50 = pvVar18;
              }
              pvVar23 = (void *)((long)pvVar23 + lVar49);
            }
            p_Var31 = &local_a8;
LAB_003a8d2b:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var31);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar32 = 0; p_Var14 = pp_Var42[-3],
                lVar32 < *(int *)(&this->field_0x108 + (long)p_Var14); lVar32 = lVar32 + 1) {
              fVar53 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var14) + lVar32 * 4);
              fVar52 = 0.0;
              if (fVar53 != 0.0) {
                fVar52 = 1.0 / (fVar53 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var14) +
                                                   lVar32 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_264,fVar52);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var14) +
                                             lVar32 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar43 = top_blob->w;
            iVar25 = top_blob->h;
            pvVar4 = (this->weight_data_tm).data;
            lVar32 = *(long *)(&this->field_0x1b0 + (long)p_Var14);
            uVar48 = 0;
            if (iVar25 < 1) {
              iVar25 = 0;
            }
            uVar17 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar17 = uVar48;
            }
            auVar128._8_4_ = 0x80000000;
            auVar128._0_8_ = 0x8000000080000000;
            auVar128._12_4_ = 0x80000000;
            auVar142._8_4_ = 0x3effffff;
            auVar142._0_8_ = 0x3effffff3effffff;
            auVar142._12_4_ = 0x3effffff;
            for (; uVar48 != uVar17; uVar48 = uVar48 + 1) {
              if (lVar32 == 0) {
                fVar53 = 0.0;
              }
              else {
                fVar53 = *(float *)(lVar32 + uVar48 * 4);
              }
              pvVar47 = (void *)(top_blob->cstep * uVar48 * top_blob->elemsize +
                                (long)top_blob->data);
              fVar52 = local_90._M_impl.super__Vector_impl_data._M_start[uVar48 * 2];
              fVar1 = local_90._M_impl.super__Vector_impl_data._M_start[uVar48 * 2 + 1];
              pvVar50 = (void *)(local_2d8.cstep * uVar48 * local_2d8.elemsize +
                                (long)local_2d8.data);
              lVar49 = uVar48 * 9;
              lVar35 = (long)pvVar50 + (long)local_2d8.w;
              pvVar23 = (void *)((long)pvVar50 + (long)local_2d8.w * 2);
              for (iVar24 = 0; iVar24 != iVar25; iVar24 = iVar24 + 1) {
                lVar39 = 0;
                for (iVar38 = iVar43; 0 < iVar38; iVar38 = iVar38 + -1) {
                  fVar54 = (fVar52 * (float)((int)*(char *)((long)pvVar4 + lVar49 + 8) *
                                             (int)*(char *)((long)pvVar23 + lVar39 + 2) +
                                             (int)*(char *)((long)pvVar4 + lVar49 + 7) *
                                             (int)*(char *)((long)pvVar23 + lVar39 + 1) +
                                            (int)*(char *)((long)pvVar4 + lVar49 + 6) *
                                            (int)*(char *)((long)pvVar23 + lVar39) +
                                            (int)*(char *)((long)pvVar4 + lVar49 + 5) *
                                            (int)*(char *)(lVar35 + 2 + lVar39) +
                                            (int)*(char *)((long)pvVar4 + lVar49 + 4) *
                                            (int)*(char *)(lVar35 + 1 + lVar39) +
                                            (int)*(char *)((long)pvVar4 + lVar49 + 3) *
                                            (int)*(char *)(lVar35 + lVar39) +
                                            (int)*(char *)((long)pvVar4 + lVar49 + 2) *
                                            (int)*(char *)((long)pvVar50 + lVar39 + 2) +
                                            (int)*(char *)((long)pvVar4 + lVar49 + 1) *
                                            (int)*(char *)((long)pvVar50 + lVar39 + 1) +
                                            (int)*(char *)((long)pvVar4 + lVar49) *
                                            (int)*(char *)((long)pvVar50 + lVar39)) + fVar53) *
                           fVar1;
                  auVar101 = vandps_avx(ZEXT416((uint)fVar54),auVar128);
                  auVar101 = vorps_avx(auVar101,auVar142);
                  auVar101 = ZEXT416((uint)(fVar54 + auVar101._0_4_));
                  auVar101 = vroundss_avx(auVar101,auVar101,0xb);
                  iVar40 = (int)auVar101._0_4_;
                  if (iVar40 < -0x7e) {
                    iVar40 = -0x7f;
                  }
                  if (0x7e < iVar40) {
                    iVar40 = 0x7f;
                  }
                  *(char *)((long)pvVar47 + lVar39) = (char)iVar40;
                  lVar39 = lVar39 + 1;
                }
                pvVar50 = (void *)((long)pvVar50 + lVar39 + 2);
                lVar35 = lVar35 + lVar39 + 2;
                pvVar23 = (void *)((long)pvVar23 + lVar39 + 2);
                pvVar47 = (void *)((long)pvVar47 + lVar39);
              }
            }
            p_Var31 = &local_90;
LAB_003a8f79:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var31);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          iVar40 = 0;
          pLVar5 = this->activation;
          if (pLVar5 != (Layer *)0x0) {
            (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
          }
          goto LAB_003a83ef;
        }
        iVar25 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var14) == 1) &&
             ((*(int *)(&this->field_0xe0 + (long)p_Var14) == 1 &&
              (*(int *)(&this->field_0xe4 + (long)p_Var14) == 2)))) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var14) == 2)) &&
           (*(uint *)(&this->field_0x110 + (long)p_Var14) < 2)) {
          if (100 < iVar2) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar32 = 0; p_Var14 = pp_Var42[-3],
                lVar32 < *(int *)(&this->field_0x108 + (long)p_Var14); lVar32 = lVar32 + 1) {
              fVar53 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var14) + lVar32 * 4);
              fVar52 = 0.0;
              if (fVar53 != 0.0) {
                fVar52 = 1.0 / (fVar53 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var14) +
                                                   lVar32 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_264,fVar52);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var14) +
                                             lVar32 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_c0,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar43 = top_blob->w;
            pvVar4 = (this->weight_data_tm).data;
            lVar32 = *(long *)(&this->field_0x1b0 + (long)p_Var14);
            lVar35 = (long)((local_2d8.w - iVar43) * 2);
            uVar48 = 0;
            iVar25 = top_blob->h;
            if (top_blob->h < 1) {
              iVar25 = 0;
            }
            uVar17 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar17 = uVar48;
            }
            auVar101._8_4_ = 0x80000000;
            auVar101._0_8_ = 0x8000000080000000;
            auVar101._12_4_ = 0x80000000;
            auVar121._8_4_ = 0x3effffff;
            auVar121._0_8_ = 0x3effffff3effffff;
            auVar121._12_4_ = 0x3effffff;
            for (; uVar48 != uVar17; uVar48 = uVar48 + 1) {
              if (lVar32 == 0) {
                fVar53 = 0.0;
              }
              else {
                fVar53 = *(float *)(lVar32 + uVar48 * 4);
              }
              puVar22 = (undefined1 *)
                        (top_blob->cstep * uVar48 * top_blob->elemsize + (long)top_blob->data);
              fVar52 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar48 * 2];
              fVar1 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar48 * 2 + 1];
              pvVar47 = (void *)(local_2d8.cstep * uVar48 * local_2d8.elemsize +
                                (long)local_2d8.data);
              lVar39 = uVar48 * 9;
              lVar49 = (long)pvVar47 + (long)local_2d8.w;
              pvVar23 = (void *)((long)pvVar47 + (long)local_2d8.w * 2);
              for (iVar24 = 0; iVar24 != iVar25; iVar24 = iVar24 + 1) {
                lVar37 = 0;
                for (iVar38 = iVar43; 0 < iVar38; iVar38 = iVar38 + -1) {
                  fVar54 = (fVar52 * (float)((int)*(char *)((long)pvVar4 + lVar39 + 8) *
                                             (int)*(char *)((long)pvVar23 + lVar37 + 2) +
                                             (int)*(char *)((long)pvVar4 + lVar39 + 7) *
                                             (int)*(char *)((long)pvVar23 + lVar37 + 1) +
                                            (int)*(char *)((long)pvVar4 + lVar39 + 6) *
                                            (int)*(char *)((long)pvVar23 + lVar37) +
                                            (int)*(char *)((long)pvVar4 + lVar39 + 5) *
                                            (int)*(char *)(lVar49 + 2 + lVar37) +
                                            (int)*(char *)((long)pvVar4 + lVar39 + 4) *
                                            (int)*(char *)(lVar49 + 1 + lVar37) +
                                            (int)*(char *)((long)pvVar4 + lVar39 + 3) *
                                            (int)*(char *)(lVar49 + lVar37) +
                                            (int)*(char *)((long)pvVar4 + lVar39 + 2) *
                                            (int)*(char *)((long)pvVar47 + lVar37 + 2) +
                                            (int)*(char *)((long)pvVar4 + lVar39 + 1) *
                                            (int)*(char *)((long)pvVar47 + lVar37 + 1) +
                                            (int)*(char *)((long)pvVar4 + lVar39) *
                                            (int)*(char *)((long)pvVar47 + lVar37)) + fVar53) *
                           fVar1;
                  auVar128 = vandps_avx(ZEXT416((uint)fVar54),auVar101);
                  auVar128 = vorps_avx(auVar128,auVar121);
                  auVar128 = ZEXT416((uint)(fVar54 + auVar128._0_4_));
                  auVar128 = vroundss_avx(auVar128,auVar128,0xb);
                  iVar40 = (int)auVar128._0_4_;
                  if (iVar40 < -0x7e) {
                    iVar40 = -0x7f;
                  }
                  if (0x7e < iVar40) {
                    iVar40 = 0x7f;
                  }
                  *puVar22 = (char)iVar40;
                  puVar22 = puVar22 + 1;
                  lVar37 = lVar37 + 2;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar37 + lVar35);
                lVar49 = lVar49 + lVar35 + lVar37;
                pvVar23 = (void *)((long)pvVar23 + lVar37 + lVar35);
              }
            }
            p_Var31 = &local_c0;
            goto LAB_003a8f79;
          }
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator = (Allocator *)0x0;
          lVar32 = 0;
          while( true ) {
            p_Var14 = pp_Var42[-3];
            if (*(int *)(&this->field_0x108 + (long)p_Var14) <= lVar32) break;
            _top_rescale = (void *)CONCAT44(iStack_264,
                                            1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                       (long)p_Var14) + lVar32 * 4)
                                                  * *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var14) + lVar32 * 4)
                                                  ));
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
            lVar32 = lVar32 + 1;
            pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
          }
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_d8,
                     (vector<float,_std::allocator<float>_> *)&opt_q);
          iVar43 = top_blob->w;
          iVar25 = top_blob->h;
          pvVar4 = (this->weight_data_tm).data;
          lVar32 = *(long *)(&this->field_0x1b0 + (long)p_Var14);
          uVar48 = top_blob->elemsize;
          local_270 = (void *)(top_blob->cstep * uVar48);
          local_278 = (long)iVar25 * (long)iVar43;
          iVar24 = 0;
          if (0 < iVar25) {
            iVar24 = iVar25;
          }
          iVar25 = top_blob->d;
          local_280 = CONCAT44(local_280._4_4_,iVar25);
          local_288 = (_func_int **)top_blob->data;
          lVar35 = (long)((local_2d8.w - iVar43) * 2);
          uVar17 = (ulong)(uint)top_blob->c;
          if (top_blob->c < 1) {
            uVar17 = 0;
          }
          iVar38 = top_blob->dims;
          pp_Var42 = local_288;
          for (uVar30 = 0; uVar30 != uVar17; uVar30 = uVar30 + 1) {
            iVar40 = (int)((uVar48 * local_278 + 0xf & 0xfffffffffffffff0) / uVar48);
            if (iVar38 == 4) {
              iVar40 = (int)local_278;
            }
            if (lVar32 == 0) {
              uVar55 = 0;
            }
            else {
              uVar55 = *(undefined4 *)(lVar32 + uVar30 * 4);
            }
            pp_Var19 = (_func_int **)((long)local_270 * uVar30 + (long)local_288);
            fVar53 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar30];
            iVar40 = iVar40 * iVar25;
            if (iVar40 < 1) {
              iVar40 = 0;
            }
            for (lVar49 = 0; iVar40 != (int)lVar49; lVar49 = lVar49 + 1) {
              *(undefined4 *)((long)pp_Var42 + lVar49 * 4) = uVar55;
            }
            lVar39 = uVar30 * 9;
            pvVar47 = (void *)(local_2d8.elemsize * local_2d8.cstep * uVar30 + (long)local_2d8.data)
            ;
            lVar49 = (long)pvVar47 + (long)local_2d8.w;
            pvVar23 = (void *)((long)pvVar47 + (long)local_2d8.w * 2);
            for (iVar40 = 0; iVar40 != iVar24; iVar40 = iVar40 + 1) {
              lVar37 = 0;
              for (iVar26 = iVar43; 0 < iVar26; iVar26 = iVar26 + -1) {
                *(float *)pp_Var19 =
                     fVar53 * (float)((int)*(char *)((long)pvVar4 + lVar39 + 8) *
                                      (int)*(char *)((long)pvVar23 + lVar37 + 2) +
                                      (int)*(char *)((long)pvVar4 + lVar39 + 7) *
                                      (int)*(char *)((long)pvVar23 + lVar37 + 1) +
                                     (int)*(char *)((long)pvVar4 + lVar39 + 6) *
                                     (int)*(char *)((long)pvVar23 + lVar37) +
                                     (int)*(char *)((long)pvVar4 + lVar39 + 5) *
                                     (int)*(char *)(lVar49 + 2 + lVar37) +
                                     (int)*(char *)((long)pvVar4 + lVar39 + 4) *
                                     (int)*(char *)(lVar49 + 1 + lVar37) +
                                     (int)*(char *)((long)pvVar4 + lVar39 + 3) *
                                     (int)*(char *)(lVar49 + lVar37) +
                                     (int)*(char *)((long)pvVar4 + lVar39 + 2) *
                                     (int)*(char *)((long)pvVar47 + lVar37 + 2) +
                                     (int)*(char *)((long)pvVar4 + lVar39 + 1) *
                                     (int)*(char *)((long)pvVar47 + lVar37 + 1) +
                                     (int)*(char *)((long)pvVar4 + lVar39) *
                                     (int)*(char *)((long)pvVar47 + lVar37)) + *(float *)pp_Var19;
                pp_Var19 = (_func_int **)((long)pp_Var19 + 4);
                lVar37 = lVar37 + 2;
              }
              pvVar47 = (void *)((long)pvVar47 + lVar37 + lVar35);
              lVar49 = lVar49 + lVar35 + lVar37;
              pvVar23 = (void *)((long)pvVar23 + lVar37 + lVar35);
            }
            pp_Var42 = (_func_int **)((long)pp_Var42 + (long)local_270);
          }
          p_Var31 = &local_d8;
          goto LAB_003a8d2b;
        }
      }
      uVar44 = iVar25 * *(int *)(&this->field_0xd4 + (long)p_Var14);
      local_280 = (size_type)(int)uVar44;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,local_280,
                 (allocator_type *)&top_rescale);
      uVar10 = opt_q._0_8_;
      local_288 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var14 = local_288[-3];
      iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var14);
      iVar38 = *(int *)(&this->field_0xdc + (long)p_Var14);
      iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var14);
      lVar32 = 0;
      iVar26 = 0;
      for (iVar27 = 0; iVar27 < *(int *)(&this->field_0xd8 + (long)p_Var14); iVar27 = iVar27 + 1) {
        for (lVar35 = 0; (int)lVar35 < *(int *)(&this->field_0xd4 + (long)p_Var14);
            lVar35 = lVar35 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar32 * 4 + lVar35 * 4) = iVar26;
          p_Var14 = local_288[-3];
          iVar26 = iVar26 + *(int *)(&this->field_0xdc + (long)p_Var14);
        }
        iVar26 = iVar26 + (iVar8 * iVar25 - iVar38 * iVar40);
        lVar32 = (int)lVar32 + lVar35;
      }
      local_2f8 = 0;
      if ((int)uVar44 < 1) {
        uVar44 = 0;
      }
      auVar69 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      for (uVar48 = 0; pvVar4 = local_2d8.data,
          (long)uVar48 < (long)*(int *)(&this->field_0x108 + (long)p_Var14); uVar48 = uVar48 + 1) {
        pfVar36 = (float *)(top_blob->elemsize * uVar48 * top_blob->cstep + (long)top_blob->data);
        lVar35 = local_2d8.cstep * uVar48 * local_2d8.elemsize;
        lVar32 = (long)local_2d8.w * local_2d8.elemsize;
        pvVar23 = (this->weight_data_tm).data;
        local_330 = pfVar36;
        local_278 = uVar48;
        for (iVar25 = 0; iVar25 <= iVar43; iVar25 = iVar25 + 1) {
          pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
          for (iVar38 = 0; iVar38 <= iVar24; iVar38 = iVar38 + 1) {
            p_Var14 = pp_Var42[-3];
            iVar40 = 0;
            for (uVar17 = 0; uVar44 != uVar17; uVar17 = uVar17 + 1) {
              iVar40 = iVar40 + (int)*(char *)((long)pvVar23 + uVar17 + local_2f8) *
                                (int)*(char *)((long)pvVar4 +
                                              (long)*(int *)(uVar10 + uVar17 * 4) +
                                              (long)iVar25 *
                                              (long)*(int *)(&this->field_0xe8 + (long)p_Var14) *
                                              lVar32 + (long)iVar38 *
                                                       (long)*(int *)(&this->field_0xe4 +
                                                                     (long)p_Var14) + lVar35);
            }
            fVar53 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var14) + uVar48 * 4);
            fVar52 = 0.0;
            if (fVar53 != 0.0) {
              fVar52 = 1.0 / (fVar53 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var14) +
                                                 uVar48 * 4));
            }
            fVar52 = fVar52 * (float)iVar40;
            if (*(int *)(&this->field_0x100 + (long)p_Var14) != 0) {
              fVar52 = fVar52 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) +
                                          uVar48 * 4);
            }
            auVar101 = ZEXT416((uint)fVar52);
            fVar53 = fVar52;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var14)) {
            case 1:
              auVar101 = vmaxss_avx(auVar101,ZEXT416(0));
              fVar53 = auVar101._0_4_;
              break;
            case 2:
              auVar101 = vcmpss_avx(ZEXT816(0) << 0x20,auVar101,1);
              auVar67._8_4_ = 0x3f800000;
              auVar67._0_8_ = 0x3f8000003f800000;
              auVar67._12_4_ = 0x3f800000;
              auVar101 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var14)),
                                       auVar67,auVar101);
              fVar54 = auVar101._0_4_;
LAB_003a8217:
              fVar53 = fVar54 * fVar52;
              break;
            case 3:
              fVar52 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var14))[1];
              auVar101 = vmaxss_avx(auVar101,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var14)
                                                    ));
              fVar53 = auVar101._0_4_;
              if (fVar52 < auVar101._0_4_) {
                fVar53 = fVar52;
              }
              break;
            case 4:
              auVar101 = vminss_avx(auVar101,ZEXT416(0x42b0c0a5));
              auVar65._0_4_ = auVar101._0_4_ ^ auVar69._0_4_;
              auVar65._4_4_ = auVar101._4_4_ ^ auVar69._4_4_;
              auVar65._8_4_ = auVar101._8_4_ ^ auVar69._8_4_;
              auVar65._12_4_ = auVar101._12_4_ ^ auVar69._12_4_;
              auVar101 = vcmpss_avx(auVar101,ZEXT416(0xc2b0c0a5),1);
              auVar66._8_4_ = 0x42b0c0a5;
              auVar66._0_8_ = 0x42b0c0a542b0c0a5;
              auVar66._12_4_ = 0x42b0c0a5;
              auVar101 = vblendvps_avx(auVar65,auVar66,auVar101);
              fVar53 = expf(auVar101._0_4_);
              auVar69 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              uVar48 = local_278;
              fVar53 = 1.0 / (fVar53 + 1.0);
              break;
            case 5:
              local_270 = (void *)CONCAT44(local_270._4_4_,fVar52);
              fVar53 = expf(fVar52);
              fVar53 = logf(fVar53 + 1.0);
              fVar53 = tanhf(fVar53);
              auVar69 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              fVar53 = fVar53 * local_270._0_4_;
              break;
            case 6:
              fVar1 = **(float **)(&this->field_0x118 + (long)p_Var14);
              fVar54 = (*(float **)(&this->field_0x118 + (long)p_Var14))[1];
              fVar90 = (float)((uint)fVar54 ^ auVar69._0_4_) / fVar1;
              fVar53 = 0.0;
              if ((fVar90 <= fVar52) && (fVar53 = fVar52, fVar52 <= fVar90 + 1.0 / fVar1)) {
                fVar54 = fVar1 * fVar52 + fVar54;
                goto LAB_003a8217;
              }
            }
            if (iVar2 < 0x65) {
              *local_330 = fVar53;
              local_330 = local_330 + 1;
            }
            else {
              fVar53 = fVar53 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var14) +
                                          uVar48 * 4);
              auVar101 = vandps_avx(ZEXT416((uint)fVar53),auVar69._0_16_);
              auVar68._8_4_ = 0x3effffff;
              auVar68._0_8_ = 0x3effffff3effffff;
              auVar68._12_4_ = 0x3effffff;
              auVar101 = vorps_avx(auVar101,auVar68);
              auVar101 = ZEXT416((uint)(fVar53 + auVar101._0_4_));
              auVar101 = vroundss_avx(auVar101,auVar101,0xb);
              iVar40 = (int)auVar101._0_4_;
              if (iVar40 < -0x7e) {
                iVar40 = -0x7f;
              }
              uVar13 = (undefined1)iVar40;
              if (0x7e < iVar40) {
                uVar13 = 0x7f;
              }
              *(undefined1 *)pfVar36 = uVar13;
              pfVar36 = (float *)((long)pfVar36 + 1);
            }
          }
        }
        p_Var14 = local_288[-3];
        local_2f8 = local_2f8 + local_280;
      }
    }
    else {
      if (iVar26 != 8) goto LAB_003a83ef;
      uVar48 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             );
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,uVar48,(allocator_type *)&top_rescale);
      pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var14 = pp_Var42[-3];
      iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var14);
      iVar38 = *(int *)(&this->field_0xdc + (long)p_Var14);
      iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var14);
      iVar29 = 0;
      lVar32 = 0;
      for (iVar26 = 0; iVar26 < *(int *)(&this->field_0xd8 + (long)p_Var14); iVar26 = iVar26 + 1) {
        for (lVar35 = 0; (int)lVar35 < *(int *)(&this->field_0xd4 + (long)p_Var14);
            lVar35 = lVar35 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar32 * 4 + lVar35 * 4) = iVar29;
          p_Var14 = pp_Var42[-3];
          iVar29 = iVar29 + *(int *)(&this->field_0xdc + (long)p_Var14);
        }
        iVar29 = iVar29 + (iVar8 * iVar25 - iVar38 * iVar40);
        lVar32 = (int)lVar32 + lVar35;
      }
      uVar30 = 0;
      uVar17 = uVar48 & 0xffffffff;
      if ((int)uVar48 < 1) {
        uVar17 = uVar30;
      }
      uVar46 = (ulong)(uint)iVar27;
      if (iVar27 < 1) {
        uVar46 = uVar30;
      }
      auVar69 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar147._8_4_ = 0x3f800000;
      auVar147._0_8_ = 0x3f8000003f800000;
      auVar147._12_4_ = 0x3f800000;
      for (uVar28 = 0; uVar28 != uVar46; uVar28 = uVar28 + 1) {
        pauVar33 = (undefined1 (*) [16])
                   (top_blob->elemsize * uVar28 * top_blob->cstep + (long)top_blob->data);
        pvVar4 = (this->weight_data_tm).data;
        pauVar34 = pauVar33;
        for (iVar25 = 0; iVar25 <= iVar43; iVar25 = iVar25 + 1) {
          pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx;
          for (iVar38 = 0; iVar38 <= iVar24; iVar38 = iVar38 + 1) {
            p_Var14 = pp_Var42[-3];
            auVar89 = ZEXT1664((undefined1  [16])0x0);
            uVar41 = 0;
            auVar108 = ZEXT1664((undefined1  [16])0x0);
            while( true ) {
              if (uVar17 == uVar41) break;
              auVar112._8_8_ = 0;
              auVar112._0_8_ =
                   *(ulong *)((long)local_2d8.data +
                             (long)*(int *)(opt_q._0_8_ + uVar41 * 4) * 8 +
                             (long)iVar25 * (long)*(int *)(&this->field_0xe8 + (long)p_Var14) *
                             (long)local_2d8.w * local_2d8.elemsize +
                             (long)(*(int *)(&this->field_0xe4 + (long)p_Var14) * iVar38 * 8) +
                             local_2d8.cstep * uVar28 * local_2d8.elemsize);
              auVar101 = vpcmpgtb_avx((undefined1  [16])0x0,auVar112);
              auVar128 = vpunpcklbw_avx(auVar112,auVar101);
              auVar117._8_8_ = 0;
              auVar117._0_8_ = *(ulong *)((long)pvVar4 + uVar41 * 8 + (long)(int)uVar30);
              auVar101 = vpcmpgtb_avx((undefined1  [16])0x0,auVar117);
              auVar101 = vpunpcklbw_avx(auVar117,auVar101);
              auVar121 = vpmullw_avx(auVar101,auVar128);
              auVar101 = vpmulhw_avx(auVar128,auVar101);
              auVar128 = vpunpcklwd_avx(auVar121,auVar101);
              auVar121 = vpunpckhwd_avx(auVar121,auVar101);
              auVar101 = vpaddd_avx(auVar108._0_16_,auVar128);
              auVar108 = ZEXT1664(auVar101);
              auVar101 = vpaddd_avx(auVar89._0_16_,auVar121);
              auVar89 = ZEXT1664(auVar101);
              uVar41 = uVar41 + 1;
            }
            auVar101 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1f8 + (long)p_Var14) + uVar28 * 0x20);
            auVar121 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1f8 + (long)p_Var14) + 0x10 + uVar28 * 0x20);
            pfVar36 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var14) + uVar28 * 0x20);
            auVar118._0_4_ = auVar101._0_4_ * *pfVar36;
            auVar118._4_4_ = auVar101._4_4_ * pfVar36[1];
            auVar118._8_4_ = auVar101._8_4_ * pfVar36[2];
            auVar118._12_4_ = auVar101._12_4_ * pfVar36[3];
            pfVar36 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var14) + 0x10 + uVar28 * 0x20
                               );
            auVar138._0_4_ = auVar121._0_4_ * *pfVar36;
            auVar138._4_4_ = auVar121._4_4_ * pfVar36[1];
            auVar138._8_4_ = auVar121._8_4_ * pfVar36[2];
            auVar138._12_4_ = auVar121._12_4_ * pfVar36[3];
            auVar128 = vrcpps_avx(auVar118);
            auVar142 = vrcpps_avx(auVar138);
            auVar101 = vcmpps_avx(auVar101,(undefined1  [16])0x0,4);
            auVar101 = vandps_avx(auVar101,auVar128);
            auVar121 = vcmpps_avx(auVar121,(undefined1  [16])0x0,4);
            auVar121 = vandps_avx(auVar121,auVar142);
            auVar128 = vcvtdq2ps_avx(auVar108._0_16_);
            auVar91._0_4_ = auVar101._0_4_ * auVar128._0_4_;
            auVar91._4_4_ = auVar101._4_4_ * auVar128._4_4_;
            auVar91._8_4_ = auVar101._8_4_ * auVar128._8_4_;
            auVar91._12_4_ = auVar101._12_4_ * auVar128._12_4_;
            auVar101 = vcvtdq2ps_avx(auVar89._0_16_);
            auVar113._0_4_ = auVar121._0_4_ * auVar101._0_4_;
            auVar113._4_4_ = auVar121._4_4_ * auVar101._4_4_;
            auVar113._8_4_ = auVar121._8_4_ * auVar101._8_4_;
            auVar113._12_4_ = auVar121._12_4_ * auVar101._12_4_;
            if (*(int *)(&this->field_0x100 + (long)p_Var14) != 0) {
              pfVar36 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) + uVar28 * 0x20);
              auVar91._0_4_ = auVar91._0_4_ + *pfVar36;
              auVar91._4_4_ = auVar91._4_4_ + pfVar36[1];
              auVar91._8_4_ = auVar91._8_4_ + pfVar36[2];
              auVar91._12_4_ = auVar91._12_4_ + pfVar36[3];
              pfVar36 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) + 0x10 +
                                 uVar28 * 0x20);
              auVar113._0_4_ = auVar113._0_4_ + *pfVar36;
              auVar113._4_4_ = auVar113._4_4_ + pfVar36[1];
              auVar113._8_4_ = auVar113._8_4_ + pfVar36[2];
              auVar113._12_4_ = auVar113._12_4_ + pfVar36[3];
            }
            auVar156 = auVar91;
            auVar84 = auVar113;
            if (5 < *(int *)(&this->field_0x110 + (long)p_Var14) - 1U)
            goto switchD_003a753c_caseD_1;
            auVar156 = vmaxps_avx(auVar91,(undefined1  [16])0x0);
            auVar84 = vmaxps_avx(auVar113,(undefined1  [16])0x0);
            auVar101 = auVar69._0_16_;
            fVar53 = auVar69._0_4_;
            fVar52 = auVar69._4_4_;
            fVar1 = auVar69._8_4_;
            fVar54 = auVar69._12_4_;
            fVar90 = auVar91._0_4_;
            fVar109 = auVar91._4_4_;
            fVar110 = auVar91._8_4_;
            fVar111 = auVar91._12_4_;
            fVar6 = auVar113._8_4_;
            fVar7 = auVar113._12_4_;
            switch(*(int *)(&this->field_0x110 + (long)p_Var14)) {
            case 2:
              auVar101 = vminps_avx(auVar91,(undefined1  [16])0x0);
              fVar53 = **(float **)(&this->field_0x118 + (long)p_Var14);
              auVar155._0_4_ = auVar156._0_4_ + fVar53 * auVar101._0_4_;
              auVar155._4_4_ = auVar156._4_4_ + fVar53 * auVar101._4_4_;
              auVar155._8_4_ = auVar156._8_4_ + fVar53 * auVar101._8_4_;
              auVar155._12_4_ = auVar156._12_4_ + fVar53 * auVar101._12_4_;
              auVar101 = vminps_avx(auVar113,(undefined1  [16])0x0);
              auVar92._0_4_ = fVar53 * auVar101._0_4_;
              auVar92._4_4_ = fVar53 * auVar101._4_4_;
              auVar92._8_4_ = fVar53 * auVar101._8_4_;
              auVar92._12_4_ = fVar53 * auVar101._12_4_;
              goto LAB_003a7ce8;
            case 3:
              uVar55 = **(undefined4 **)(&this->field_0x118 + (long)p_Var14);
              auVar77._4_4_ = uVar55;
              auVar77._0_4_ = uVar55;
              auVar77._8_4_ = uVar55;
              auVar77._12_4_ = uVar55;
              uVar55 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var14))[1];
              auVar132._4_4_ = uVar55;
              auVar132._0_4_ = uVar55;
              auVar132._8_4_ = uVar55;
              auVar132._12_4_ = uVar55;
              auVar101 = vmaxps_avx(auVar91,auVar77);
              auVar156 = vminps_avx(auVar101,auVar132);
              auVar101 = vmaxps_avx(auVar113,auVar77);
              auVar84 = vminps_avx(auVar101,auVar132);
              break;
            case 4:
              auVar78._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar78._8_4_ = -fVar110;
              auVar78._12_4_ = -fVar111;
              auVar153._8_4_ = 0x42b0c0a5;
              auVar153._0_8_ = 0x42b0c0a542b0c0a5;
              auVar153._12_4_ = 0x42b0c0a5;
              auVar121 = vminps_avx(auVar153,auVar78);
              auVar154._8_4_ = 0xc2b0c0a5;
              auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar154._12_4_ = 0xc2b0c0a5;
              auVar142 = vmaxps_avx(auVar154,auVar121);
              auVar102._0_4_ = auVar142._0_4_ * 1.442695 + fVar53;
              auVar102._4_4_ = auVar142._4_4_ * 1.442695 + fVar52;
              auVar102._8_4_ = auVar142._8_4_ * 1.442695 + fVar1;
              auVar102._12_4_ = auVar142._12_4_ * 1.442695 + fVar54;
              auVar133._0_4_ = (int)auVar102._0_4_;
              auVar133._4_4_ = (int)auVar102._4_4_;
              auVar133._8_4_ = (int)auVar102._8_4_;
              auVar133._12_4_ = (int)auVar102._12_4_;
              auVar128 = vcvtdq2ps_avx(auVar133);
              auVar121 = vcmpps_avx(auVar102,auVar128,1);
              auVar121 = vandps_avx(auVar147,auVar121);
              auVar121 = vsubps_avx(auVar128,auVar121);
              auVar134._0_4_ = auVar121._0_4_ * 0.6931472;
              auVar134._4_4_ = auVar121._4_4_ * 0.6931472;
              auVar134._8_4_ = auVar121._8_4_ * 0.6931472;
              auVar134._12_4_ = auVar121._12_4_ * 0.6931472;
              auVar128 = vsubps_avx(auVar142,auVar134);
              fVar90 = auVar128._0_4_;
              fVar109 = auVar128._4_4_;
              fVar110 = auVar128._8_4_;
              fVar111 = auVar128._12_4_;
              auVar103._0_4_ = (int)auVar121._0_4_;
              auVar103._4_4_ = (int)auVar121._4_4_;
              auVar103._8_4_ = (int)auVar121._8_4_;
              auVar103._12_4_ = (int)auVar121._12_4_;
              auVar121 = vpslld_avx(auVar103,0x17);
              auVar121 = vpaddd_avx(auVar147,auVar121);
              auVar79._0_4_ =
                   (fVar90 + 1.0 +
                   fVar90 * fVar90 *
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + fVar53)) * auVar121._0_4_ + 1.0;
              auVar79._4_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar52)) * auVar121._4_4_ +
                   1.0;
              auVar79._8_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar1)) * auVar121._8_4_ + 1.0
              ;
              auVar79._12_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + fVar54)) * auVar121._12_4_ +
                   1.0;
              auVar121 = vrcpps_avx(auVar79);
              fVar90 = auVar121._0_4_;
              auVar80._0_4_ = auVar79._0_4_ * fVar90;
              fVar109 = auVar121._4_4_;
              auVar80._4_4_ = auVar79._4_4_ * fVar109;
              fVar110 = auVar121._8_4_;
              auVar80._8_4_ = auVar79._8_4_ * fVar110;
              fVar111 = auVar121._12_4_;
              auVar80._12_4_ = auVar79._12_4_ * fVar111;
              auVar121 = vsubps_avx(auVar147,auVar80);
              auVar155._0_4_ = fVar90 + fVar90 * auVar121._0_4_;
              auVar155._4_4_ = fVar109 + fVar109 * auVar121._4_4_;
              auVar155._8_4_ = fVar110 + fVar110 * auVar121._8_4_;
              auVar155._12_4_ = fVar111 + fVar111 * auVar121._12_4_;
              auVar81._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
              auVar81._8_4_ = -fVar6;
              auVar81._12_4_ = -fVar7;
              auVar121 = vminps_avx(auVar153,auVar81);
              auVar142 = vmaxps_avx(auVar154,auVar121);
              auVar104._0_4_ = auVar142._0_4_ * 1.442695 + fVar53;
              auVar104._4_4_ = auVar142._4_4_ * 1.442695 + fVar52;
              auVar104._8_4_ = auVar142._8_4_ * 1.442695 + fVar1;
              auVar104._12_4_ = auVar142._12_4_ * 1.442695 + fVar54;
              auVar114._0_4_ = (int)auVar104._0_4_;
              auVar114._4_4_ = (int)auVar104._4_4_;
              auVar114._8_4_ = (int)auVar104._8_4_;
              auVar114._12_4_ = (int)auVar104._12_4_;
              auVar128 = vcvtdq2ps_avx(auVar114);
              auVar121 = vcmpps_avx(auVar104,auVar128,1);
              auVar121 = vandps_avx(auVar147,auVar121);
              auVar121 = vsubps_avx(auVar128,auVar121);
              auVar115._0_4_ = auVar121._0_4_ * 0.6931472;
              auVar115._4_4_ = auVar121._4_4_ * 0.6931472;
              auVar115._8_4_ = auVar121._8_4_ * 0.6931472;
              auVar115._12_4_ = auVar121._12_4_ * 0.6931472;
              auVar128 = vsubps_avx(auVar142,auVar115);
              fVar90 = auVar128._0_4_;
              fVar109 = auVar128._4_4_;
              fVar110 = auVar128._8_4_;
              fVar111 = auVar128._12_4_;
              auVar69 = ZEXT1664(auVar101);
              auVar105._0_4_ = (int)auVar121._0_4_;
              auVar105._4_4_ = (int)auVar121._4_4_;
              auVar105._8_4_ = (int)auVar121._8_4_;
              auVar105._12_4_ = (int)auVar121._12_4_;
              auVar101 = vpslld_avx(auVar105,0x17);
              auVar101 = vpaddd_avx(auVar147,auVar101);
              auVar82._0_4_ =
                   (fVar90 + 1.0 +
                   fVar90 * fVar90 *
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + fVar53)) * auVar101._0_4_ + 1.0;
              auVar82._4_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar52)) * auVar101._4_4_ +
                   1.0;
              auVar82._8_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar1)) * auVar101._8_4_ + 1.0
              ;
              auVar82._12_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + fVar54)) * auVar101._12_4_ +
                   1.0;
              auVar92 = vrcpps_avx(auVar82);
              auVar83._0_4_ = auVar82._0_4_ * auVar92._0_4_;
              auVar83._4_4_ = auVar82._4_4_ * auVar92._4_4_;
              auVar83._8_4_ = auVar82._8_4_ * auVar92._8_4_;
              auVar83._12_4_ = auVar82._12_4_ * auVar92._12_4_;
              auVar101 = vsubps_avx(auVar147,auVar83);
              auVar84._0_4_ = auVar92._0_4_ * auVar101._0_4_;
              auVar84._4_4_ = auVar92._4_4_ * auVar101._4_4_;
              auVar84._8_4_ = auVar92._8_4_ * auVar101._8_4_;
              auVar84._12_4_ = auVar92._12_4_ * auVar101._12_4_;
LAB_003a7ce8:
              auVar85._0_4_ = auVar92._0_4_ + auVar84._0_4_;
              auVar85._4_4_ = auVar92._4_4_ + auVar84._4_4_;
              auVar85._8_4_ = auVar92._8_4_ + auVar84._8_4_;
              auVar85._12_4_ = auVar92._12_4_ + auVar84._12_4_;
              auVar156 = auVar155;
              auVar84 = auVar85;
              break;
            case 5:
              auVar56._8_4_ = 0x42b0c0a5;
              auVar56._0_8_ = 0x42b0c0a542b0c0a5;
              auVar56._12_4_ = 0x42b0c0a5;
              auVar121 = vminps_avx(auVar91,auVar56);
              auVar57._8_4_ = 0xc2b0c0a5;
              auVar57._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar57._12_4_ = 0xc2b0c0a5;
              auVar142 = vmaxps_avx(auVar121,auVar57);
              auVar119._0_4_ = auVar142._0_4_ * 1.442695 + fVar53;
              auVar119._4_4_ = auVar142._4_4_ * 1.442695 + fVar52;
              auVar119._8_4_ = auVar142._8_4_ * 1.442695 + fVar1;
              auVar119._12_4_ = auVar142._12_4_ * 1.442695 + fVar54;
              auVar139._0_4_ = (int)auVar119._0_4_;
              auVar139._4_4_ = (int)auVar119._4_4_;
              auVar139._8_4_ = (int)auVar119._8_4_;
              auVar139._12_4_ = (int)auVar119._12_4_;
              auVar128 = vcvtdq2ps_avx(auVar139);
              auVar121 = vcmpps_avx(auVar119,auVar128,1);
              auVar121 = vandps_avx(auVar147,auVar121);
              auVar121 = vsubps_avx(auVar128,auVar121);
              auVar140._0_4_ = auVar121._0_4_ * 0.6931472;
              auVar140._4_4_ = auVar121._4_4_ * 0.6931472;
              auVar140._8_4_ = auVar121._8_4_ * 0.6931472;
              auVar140._12_4_ = auVar121._12_4_ * 0.6931472;
              auVar128 = vsubps_avx(auVar142,auVar140);
              fVar116 = auVar128._0_4_;
              fVar135 = auVar128._4_4_;
              fVar136 = auVar128._8_4_;
              fVar137 = auVar128._12_4_;
              auVar120._0_4_ = (int)auVar121._0_4_;
              auVar120._4_4_ = (int)auVar121._4_4_;
              auVar120._8_4_ = (int)auVar121._8_4_;
              auVar120._12_4_ = (int)auVar121._12_4_;
              auVar121 = vpslld_avx(auVar120,0x17);
              auVar121 = vpaddd_avx(auVar147,auVar121);
              auVar122._0_4_ =
                   (fVar116 + 1.0 +
                   (((((fVar116 * 0.00019875691 + 0.0013981999) * fVar116 + 0.008333452) * fVar116 +
                     0.041665796) * fVar116 + 0.16666666) * fVar116 + fVar53) * fVar116 * fVar116) *
                   auVar121._0_4_ + 1.0;
              auVar122._4_4_ =
                   (fVar135 + 1.0 +
                   (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                     0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar52) * fVar135 * fVar135) *
                   auVar121._4_4_ + 1.0;
              auVar122._8_4_ =
                   (fVar136 + 1.0 +
                   (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                     0.041665796) * fVar136 + 0.16666666) * fVar136 + fVar1) * fVar136 * fVar136) *
                   auVar121._8_4_ + 1.0;
              auVar122._12_4_ =
                   (fVar137 + 1.0 +
                   (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                     0.041665796) * fVar137 + 0.16666666) * fVar137 + fVar54) * fVar137 * fVar137) *
                   auVar121._12_4_ + 1.0;
              auVar128 = vcmpps_avx(auVar122,(undefined1  [16])0x0,2);
              auVar141._8_4_ = 0x800000;
              auVar141._0_8_ = 0x80000000800000;
              auVar141._12_4_ = 0x800000;
              auVar121 = vmaxps_avx(auVar122,auVar141);
              auVar142 = vpsrld_avx(auVar121,0x17);
              auVar148._8_4_ = 0x807fffff;
              auVar148._0_8_ = 0x807fffff807fffff;
              auVar148._12_4_ = 0x807fffff;
              auVar121 = vandps_avx(auVar148,auVar121);
              auVar66 = vorps_avx(auVar121,auVar101);
              auVar149._8_4_ = 0xffffff82;
              auVar149._0_8_ = 0xffffff82ffffff82;
              auVar149._12_4_ = 0xffffff82;
              auVar121 = vpaddd_avx(auVar149,auVar142);
              auVar65 = vcvtdq2ps_avx(auVar121);
              auVar150._8_4_ = 0x3f3504f3;
              auVar150._0_8_ = 0x3f3504f33f3504f3;
              auVar150._12_4_ = 0x3f3504f3;
              auVar142 = vcmpps_avx(auVar66,auVar150,1);
              auVar121 = vandps_avx(auVar142,auVar66);
              fVar116 = auVar121._0_4_ + auVar66._0_4_ + -1.0;
              fVar135 = auVar121._4_4_ + auVar66._4_4_ + -1.0;
              fVar136 = auVar121._8_4_ + auVar66._8_4_ + -1.0;
              fVar137 = auVar121._12_4_ + auVar66._12_4_ + -1.0;
              auVar121 = vandps_avx(auVar142,auVar147);
              auVar121 = vsubps_avx(auVar65,auVar121);
              auVar123._0_4_ =
                   (fVar116 * fVar116 *
                    (((((((((fVar116 * 0.070376836 + -0.1151461) * fVar116 + 0.116769984) * fVar116
                          + -0.12420141) * fVar116 + 0.14249323) * fVar116 + -0.16668057) * fVar116
                       + 0.20000714) * fVar116 + -0.24999994) * fVar116 + 0.3333333) * fVar116 +
                    -0.5) + auVar121._0_4_ * 0.6931472 + fVar116) * -2.0;
              auVar123._4_4_ =
                   (fVar135 * fVar135 *
                    (((((((((fVar135 * 0.070376836 + -0.1151461) * fVar135 + 0.116769984) * fVar135
                          + -0.12420141) * fVar135 + 0.14249323) * fVar135 + -0.16668057) * fVar135
                       + 0.20000714) * fVar135 + -0.24999994) * fVar135 + 0.3333333) * fVar135 +
                    -0.5) + auVar121._4_4_ * 0.6931472 + fVar135) * -2.0;
              auVar123._8_4_ =
                   (fVar136 * fVar136 *
                    (((((((((fVar136 * 0.070376836 + -0.1151461) * fVar136 + 0.116769984) * fVar136
                          + -0.12420141) * fVar136 + 0.14249323) * fVar136 + -0.16668057) * fVar136
                       + 0.20000714) * fVar136 + -0.24999994) * fVar136 + 0.3333333) * fVar136 +
                    -0.5) + auVar121._8_4_ * 0.6931472 + fVar136) * -2.0;
              auVar123._12_4_ =
                   (fVar137 * fVar137 *
                    (((((((((fVar137 * 0.070376836 + -0.1151461) * fVar137 + 0.116769984) * fVar137
                          + -0.12420141) * fVar137 + 0.14249323) * fVar137 + -0.16668057) * fVar137
                       + 0.20000714) * fVar137 + -0.24999994) * fVar137 + 0.3333333) * fVar137 +
                    -0.5) + auVar121._12_4_ * 0.6931472 + fVar137) * -2.0;
              auVar151._8_4_ = 0x7fffffff;
              auVar151._0_8_ = 0x7fffffff7fffffff;
              auVar151._12_4_ = 0x7fffffff;
              auVar121 = vblendvps_avx(auVar123,auVar151,auVar128);
              auVar58._8_4_ = 0x42b0c0a5;
              auVar58._0_8_ = 0x42b0c0a542b0c0a5;
              auVar58._12_4_ = 0x42b0c0a5;
              auVar121 = vminps_avx(auVar121,auVar58);
              auVar59._8_4_ = 0xc2b0c0a5;
              auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar59._12_4_ = 0xc2b0c0a5;
              auVar142 = vmaxps_avx(auVar121,auVar59);
              auVar124._0_4_ = auVar142._0_4_ * 1.442695 + fVar53;
              auVar124._4_4_ = auVar142._4_4_ * 1.442695 + fVar52;
              auVar124._8_4_ = auVar142._8_4_ * 1.442695 + fVar1;
              auVar124._12_4_ = auVar142._12_4_ * 1.442695 + fVar54;
              auVar143._0_4_ = (int)auVar124._0_4_;
              auVar143._4_4_ = (int)auVar124._4_4_;
              auVar143._8_4_ = (int)auVar124._8_4_;
              auVar143._12_4_ = (int)auVar124._12_4_;
              auVar128 = vcvtdq2ps_avx(auVar143);
              auVar121 = vcmpps_avx(auVar124,auVar128,1);
              auVar121 = vandps_avx(auVar147,auVar121);
              auVar121 = vsubps_avx(auVar128,auVar121);
              auVar144._0_4_ = auVar121._0_4_ * 0.6931472;
              auVar144._4_4_ = auVar121._4_4_ * 0.6931472;
              auVar144._8_4_ = auVar121._8_4_ * 0.6931472;
              auVar144._12_4_ = auVar121._12_4_ * 0.6931472;
              auVar128 = vsubps_avx(auVar142,auVar144);
              fVar116 = auVar128._0_4_;
              fVar135 = auVar128._4_4_;
              fVar136 = auVar128._8_4_;
              fVar137 = auVar128._12_4_;
              auVar125._0_4_ = (int)auVar121._0_4_;
              auVar125._4_4_ = (int)auVar121._4_4_;
              auVar125._8_4_ = (int)auVar121._8_4_;
              auVar125._12_4_ = (int)auVar121._12_4_;
              auVar121 = vpslld_avx(auVar125,0x17);
              auVar121 = vpaddd_avx(auVar147,auVar121);
              auVar70._0_4_ =
                   (fVar116 + 1.0 +
                   (((((fVar116 * 0.00019875691 + 0.0013981999) * fVar116 + 0.008333452) * fVar116 +
                     0.041665796) * fVar116 + 0.16666666) * fVar116 + fVar53) * fVar116 * fVar116) *
                   auVar121._0_4_ + 1.0;
              auVar70._4_4_ =
                   (fVar135 + 1.0 +
                   (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                     0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar52) * fVar135 * fVar135) *
                   auVar121._4_4_ + 1.0;
              auVar70._8_4_ =
                   (fVar136 + 1.0 +
                   (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                     0.041665796) * fVar136 + 0.16666666) * fVar136 + fVar1) * fVar136 * fVar136) *
                   auVar121._8_4_ + 1.0;
              auVar70._12_4_ =
                   (fVar137 + 1.0 +
                   (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                     0.041665796) * fVar137 + 0.16666666) * fVar137 + fVar54) * fVar137 * fVar137) *
                   auVar121._12_4_ + 1.0;
              auVar121 = vrcpps_avx(auVar70);
              fVar116 = auVar121._0_4_;
              fVar135 = auVar121._4_4_;
              fVar136 = auVar121._8_4_;
              fVar137 = auVar121._12_4_;
              auVar71._0_4_ = auVar70._0_4_ * (fVar116 + fVar116);
              auVar71._4_4_ = auVar70._4_4_ * (fVar135 + fVar135);
              auVar71._8_4_ = auVar70._8_4_ * (fVar136 + fVar136);
              auVar71._12_4_ = auVar70._12_4_ * (fVar137 + fVar137);
              auVar152._8_4_ = 0x40000000;
              auVar152._0_8_ = 0x4000000040000000;
              auVar152._12_4_ = 0x40000000;
              auVar121 = vsubps_avx(auVar152,auVar71);
              auVar156._0_4_ = (fVar116 + fVar116 + -1.0 + fVar116 * auVar121._0_4_) * fVar90;
              auVar156._4_4_ = (fVar135 + fVar135 + -1.0 + fVar135 * auVar121._4_4_) * fVar109;
              auVar156._8_4_ = (fVar136 + fVar136 + -1.0 + fVar136 * auVar121._8_4_) * fVar110;
              auVar156._12_4_ = (fVar137 + fVar137 + -1.0 + fVar137 * auVar121._12_4_) * fVar111;
              auVar72._8_4_ = 0x42b0c0a5;
              auVar72._0_8_ = 0x42b0c0a542b0c0a5;
              auVar72._12_4_ = 0x42b0c0a5;
              auVar121 = vminps_avx(auVar113,auVar72);
              auVar93._8_4_ = 0xc2b0c0a5;
              auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar93._12_4_ = 0xc2b0c0a5;
              auVar142 = vmaxps_avx(auVar121,auVar93);
              auVar94._0_4_ = auVar142._0_4_ * 1.442695 + fVar53;
              auVar94._4_4_ = auVar142._4_4_ * 1.442695 + fVar52;
              auVar94._8_4_ = auVar142._8_4_ * 1.442695 + fVar1;
              auVar94._12_4_ = auVar142._12_4_ * 1.442695 + fVar54;
              auVar126._0_4_ = (int)auVar94._0_4_;
              auVar126._4_4_ = (int)auVar94._4_4_;
              auVar126._8_4_ = (int)auVar94._8_4_;
              auVar126._12_4_ = (int)auVar94._12_4_;
              auVar128 = vcvtdq2ps_avx(auVar126);
              auVar121 = vcmpps_avx(auVar94,auVar128,1);
              auVar121 = vandps_avx(auVar147,auVar121);
              auVar121 = vsubps_avx(auVar128,auVar121);
              auVar127._0_4_ = auVar121._0_4_ * 0.6931472;
              auVar127._4_4_ = auVar121._4_4_ * 0.6931472;
              auVar127._8_4_ = auVar121._8_4_ * 0.6931472;
              auVar127._12_4_ = auVar121._12_4_ * 0.6931472;
              auVar128 = vsubps_avx(auVar142,auVar127);
              fVar90 = auVar128._0_4_;
              fVar109 = auVar128._4_4_;
              fVar110 = auVar128._8_4_;
              fVar111 = auVar128._12_4_;
              auVar95._0_4_ = (int)auVar121._0_4_;
              auVar95._4_4_ = (int)auVar121._4_4_;
              auVar95._8_4_ = (int)auVar121._8_4_;
              auVar95._12_4_ = (int)auVar121._12_4_;
              auVar121 = vpslld_avx(auVar95,0x17);
              auVar121 = vpaddd_avx(auVar147,auVar121);
              auVar73._0_4_ =
                   (fVar90 + 1.0 +
                   fVar90 * fVar90 *
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + fVar53)) * auVar121._0_4_ + 1.0;
              auVar73._4_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar52)) * auVar121._4_4_ +
                   1.0;
              auVar73._8_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar1)) * auVar121._8_4_ + 1.0
              ;
              auVar73._12_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + fVar54)) * auVar121._12_4_ +
                   1.0;
              auVar60._8_4_ = 0x800000;
              auVar60._0_8_ = 0x80000000800000;
              auVar60._12_4_ = 0x800000;
              auVar121 = vmaxps_avx(auVar73,auVar60);
              auVar128 = vpsrld_avx(auVar121,0x17);
              auVar61._8_4_ = 0x807fffff;
              auVar61._0_8_ = 0x807fffff807fffff;
              auVar61._12_4_ = 0x807fffff;
              auVar121 = vandps_avx(auVar121,auVar61);
              auVar142 = vorps_avx(auVar121,auVar101);
              auVar62._8_4_ = 0xffffff82;
              auVar62._0_8_ = 0xffffff82ffffff82;
              auVar62._12_4_ = 0xffffff82;
              auVar101 = vpaddd_avx(auVar128,auVar62);
              auVar128 = vcvtdq2ps_avx(auVar101);
              auVar63._8_4_ = 0x3f3504f3;
              auVar63._0_8_ = 0x3f3504f33f3504f3;
              auVar63._12_4_ = 0x3f3504f3;
              auVar121 = vcmpps_avx(auVar142,auVar63,1);
              auVar101 = vandps_avx(auVar121,auVar142);
              fVar90 = auVar101._0_4_ + auVar142._0_4_ + -1.0;
              fVar109 = auVar101._4_4_ + auVar142._4_4_ + -1.0;
              fVar110 = auVar101._8_4_ + auVar142._8_4_ + -1.0;
              fVar111 = auVar101._12_4_ + auVar142._12_4_ + -1.0;
              auVar101 = vandps_avx(auVar147,auVar121);
              auVar121 = vsubps_avx(auVar128,auVar101);
              auVar101 = vcmpps_avx(auVar73,(undefined1  [16])0x0,2);
              auVar96._0_4_ =
                   (auVar121._0_4_ * 0.6931472 + fVar90 +
                   (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) * fVar90 +
                         -0.12420141) * fVar90 + 0.14249323) * fVar90 + -0.16668057) * fVar90 +
                      0.20000714) * fVar90 + -0.24999994) * fVar90 + 0.3333333) * fVar90 + -0.5) *
                   fVar90 * fVar90) * -2.0;
              auVar96._4_4_ =
                   (auVar121._4_4_ * 0.6931472 + fVar109 +
                   (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                         -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                      0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5)
                   * fVar109 * fVar109) * -2.0;
              auVar96._8_4_ =
                   (auVar121._8_4_ * 0.6931472 + fVar110 +
                   (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) * fVar110 +
                         -0.12420141) * fVar110 + 0.14249323) * fVar110 + -0.16668057) * fVar110 +
                      0.20000714) * fVar110 + -0.24999994) * fVar110 + 0.3333333) * fVar110 + -0.5)
                   * fVar110 * fVar110) * -2.0;
              auVar96._12_4_ =
                   (auVar121._12_4_ * 0.6931472 + fVar111 +
                   (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                         -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                      0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5)
                   * fVar111 * fVar111) * -2.0;
              auVar129._8_4_ = 0x7fffffff;
              auVar129._0_8_ = 0x7fffffff7fffffff;
              auVar129._12_4_ = 0x7fffffff;
              auVar101 = vblendvps_avx(auVar96,auVar129,auVar101);
              auVar97._8_4_ = 0x42b0c0a5;
              auVar97._0_8_ = 0x42b0c0a542b0c0a5;
              auVar97._12_4_ = 0x42b0c0a5;
              auVar101 = vminps_avx(auVar101,auVar97);
              auVar98._8_4_ = 0xc2b0c0a5;
              auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar98._12_4_ = 0xc2b0c0a5;
              auVar128 = vmaxps_avx(auVar101,auVar98);
              auVar99._0_4_ = auVar128._0_4_ * 1.442695 + fVar53;
              auVar99._4_4_ = auVar128._4_4_ * 1.442695 + fVar52;
              auVar99._8_4_ = auVar128._8_4_ * 1.442695 + fVar1;
              auVar99._12_4_ = auVar128._12_4_ * 1.442695 + fVar54;
              auVar130._0_4_ = (int)auVar99._0_4_;
              auVar130._4_4_ = (int)auVar99._4_4_;
              auVar130._8_4_ = (int)auVar99._8_4_;
              auVar130._12_4_ = (int)auVar99._12_4_;
              auVar121 = vcvtdq2ps_avx(auVar130);
              auVar101 = vcmpps_avx(auVar99,auVar121,1);
              auVar101 = vandps_avx(auVar147,auVar101);
              auVar101 = vsubps_avx(auVar121,auVar101);
              auVar131._0_4_ = auVar101._0_4_ * 0.6931472;
              auVar131._4_4_ = auVar101._4_4_ * 0.6931472;
              auVar131._8_4_ = auVar101._8_4_ * 0.6931472;
              auVar131._12_4_ = auVar101._12_4_ * 0.6931472;
              auVar121 = vsubps_avx(auVar128,auVar131);
              fVar90 = auVar121._0_4_;
              fVar109 = auVar121._4_4_;
              fVar110 = auVar121._8_4_;
              fVar111 = auVar121._12_4_;
              auVar100._0_4_ = (int)auVar101._0_4_;
              auVar100._4_4_ = (int)auVar101._4_4_;
              auVar100._8_4_ = (int)auVar101._8_4_;
              auVar100._12_4_ = (int)auVar101._12_4_;
              auVar101 = vpslld_avx(auVar100,0x17);
              auVar101 = vpaddd_avx(auVar147,auVar101);
              auVar74._0_4_ =
                   (fVar90 + 1.0 +
                   fVar90 * fVar90 *
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + fVar53)) * auVar101._0_4_ + 1.0;
              auVar74._4_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar52)) * auVar101._4_4_ +
                   1.0;
              auVar74._8_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar1)) * auVar101._8_4_ + 1.0
              ;
              auVar74._12_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + fVar54)) * auVar101._12_4_ +
                   1.0;
              auVar101 = vrcpps_avx(auVar74);
              fVar53 = auVar101._0_4_;
              fVar52 = auVar101._4_4_;
              fVar1 = auVar101._8_4_;
              fVar54 = auVar101._12_4_;
              auVar75._0_4_ = auVar74._0_4_ * (fVar53 + fVar53);
              auVar75._4_4_ = auVar74._4_4_ * (fVar52 + fVar52);
              auVar75._8_4_ = auVar74._8_4_ * (fVar1 + fVar1);
              auVar75._12_4_ = auVar74._12_4_ * (fVar54 + fVar54);
              auVar145._8_4_ = 0x40000000;
              auVar145._0_8_ = 0x4000000040000000;
              auVar145._12_4_ = 0x40000000;
              auVar101 = vsubps_avx(auVar145,auVar75);
              auVar76._0_4_ = fVar53 + fVar53 + -1.0 + fVar53 * auVar101._0_4_;
              auVar76._4_4_ = fVar52 + fVar52 + -1.0 + fVar52 * auVar101._4_4_;
              auVar76._8_4_ = fVar1 + fVar1 + -1.0 + fVar1 * auVar101._8_4_;
              auVar76._12_4_ = fVar54 + fVar54 + -1.0 + fVar54 * auVar101._12_4_;
              goto LAB_003a7d25;
            case 6:
              fVar53 = **(float **)(&this->field_0x118 + (long)p_Var14);
              fVar52 = (*(float **)(&this->field_0x118 + (long)p_Var14))[1];
              auVar146._0_4_ = fVar53 * fVar90 + fVar52;
              auVar146._4_4_ = fVar53 * fVar109 + fVar52;
              auVar146._8_4_ = fVar53 * fVar110 + fVar52;
              auVar146._12_4_ = fVar53 * fVar111 + fVar52;
              auVar101 = vmaxps_avx(auVar146,(undefined1  [16])0x0);
              auVar101 = vminps_avx(auVar147,auVar101);
              auVar156._0_4_ = auVar101._0_4_ * fVar90;
              auVar156._4_4_ = auVar101._4_4_ * fVar109;
              auVar156._8_4_ = auVar101._8_4_ * fVar110;
              auVar156._12_4_ = auVar101._12_4_ * fVar111;
              auVar86._0_4_ = fVar53 * auVar113._0_4_ + fVar52;
              auVar86._4_4_ = fVar53 * auVar113._4_4_ + fVar52;
              auVar86._8_4_ = fVar53 * fVar6 + fVar52;
              auVar86._12_4_ = fVar53 * fVar7 + fVar52;
              auVar101 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
              auVar76 = vminps_avx(auVar147,auVar101);
LAB_003a7d25:
              auVar84._0_4_ = auVar76._0_4_ * auVar113._0_4_;
              auVar84._4_4_ = auVar76._4_4_ * auVar113._4_4_;
              auVar84._8_4_ = auVar76._8_4_ * fVar6;
              auVar84._12_4_ = auVar76._12_4_ * fVar7;
            }
switchD_003a753c_caseD_1:
            if (iVar2 < 0x65) {
              *pauVar34 = auVar156;
              pauVar34[1] = auVar84;
              pauVar34 = pauVar34 + 2;
            }
            else {
              pfVar36 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var14) + uVar28 * 0x20);
              auVar106._0_4_ = auVar156._0_4_ * *pfVar36;
              auVar106._4_4_ = auVar156._4_4_ * pfVar36[1];
              auVar106._8_4_ = auVar156._8_4_ * pfVar36[2];
              auVar106._12_4_ = auVar156._12_4_ * pfVar36[3];
              pfVar36 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var14) + 0x10 +
                                 uVar28 * 0x20);
              auVar87._0_4_ = auVar84._0_4_ * *pfVar36;
              auVar87._4_4_ = auVar84._4_4_ * pfVar36[1];
              auVar87._8_4_ = auVar84._8_4_ * pfVar36[2];
              auVar87._12_4_ = auVar84._12_4_ * pfVar36[3];
              auVar64._8_4_ = 0x80000000;
              auVar64._0_8_ = 0x8000000080000000;
              auVar64._12_4_ = 0x80000000;
              auVar101 = vandps_avx(auVar106,auVar64);
              auVar121 = vandps_avx(auVar87,auVar64);
              auVar101 = vorps_avx(auVar101,auVar69._0_16_);
              auVar121 = vorps_avx(auVar121,auVar69._0_16_);
              auVar107._0_4_ = (int)(auVar106._0_4_ + auVar101._0_4_);
              auVar107._4_4_ = (int)(auVar106._4_4_ + auVar101._4_4_);
              auVar107._8_4_ = (int)(auVar106._8_4_ + auVar101._8_4_);
              auVar107._12_4_ = (int)(auVar106._12_4_ + auVar101._12_4_);
              auVar88._0_4_ = (int)(auVar87._0_4_ + auVar121._0_4_);
              auVar88._4_4_ = (int)(auVar87._4_4_ + auVar121._4_4_);
              auVar88._8_4_ = (int)(auVar87._8_4_ + auVar121._8_4_);
              auVar88._12_4_ = (int)(auVar87._12_4_ + auVar121._12_4_);
              auVar101 = vpackssdw_avx(auVar107,auVar88);
              auVar101 = vpminsw_avx(auVar101,_DAT_004f5590);
              auVar101 = vpmaxsw_avx(auVar101,_DAT_004f55a0);
              auVar101 = vpacksswb_avx(auVar101,auVar101);
              *(long *)*pauVar33 = auVar101._0_8_;
              pauVar33 = (undefined1 (*) [16])((long)*pauVar33 + 8);
            }
          }
        }
        uVar30 = (ulong)(uint)((int)uVar30 + (int)uVar48 * 8);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
    iVar40 = 0;
    goto LAB_003a83ef;
  }
  uVar21 = *(uint *)(&this->field_0xd0 + (long)p_Var14);
  iVar43 = *(int *)(&this->field_0x10c + (long)p_Var14);
  if (opt->use_packing_layout == true) {
    if (iVar43 < 0x65) {
      uVar48 = (ulong)((uint)((uVar21 & 3) == 0) * 3 + 1);
    }
    else {
      uVar48 = 1;
      if ((uVar21 & 7) == 0) {
        uVar48 = 8;
      }
    }
  }
  else {
    uVar48 = 1;
  }
  _elempack = (uint)uVar48;
  uVar17 = (ulong)(_elempack * 4);
  if (100 < iVar43) {
    uVar17 = uVar48;
  }
  Mat::create(top_blob,iVar25,iVar38,(int)uVar21 / (int)_elempack,uVar17,_elempack,
              opt->blob_allocator);
  auVar11 = (undefined1  [32])opt_q._32_32_;
  sVar9 = local_2d8.cstep;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003a83ef;
  uVar30 = (long)(int)uVar20 /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  uVar46 = (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  if (opt->use_packing_layout == true) {
    uVar20 = 1;
    if ((uVar30 & 7) == 0) {
      uVar20 = uVar44;
    }
    if (iVar43 < 0x65) {
      uVar21 = (uint)((uVar46 & 3) == 0) * 3 + 1;
    }
    else {
      uVar21 = 1;
      if ((uVar46 & 7) == 0) {
        uVar21 = uVar44;
      }
    }
  }
  else {
    uVar20 = 1;
    uVar21 = uVar20;
  }
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  opt_q.blob_allocator = (Allocator *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  opt_q._0_8_ = local_2d8.data;
  opt_q.workspace_allocator = (Allocator *)local_2d8.elemsize;
  opt_q.openmp_blocktime = local_2d8.elempack;
  opt_q.use_subgroup_shuffle = (bool)(undefined1)local_2d8.w;
  opt_q.use_image_storage = (bool)local_2d8.w._1_1_;
  opt_q.use_tensor_storage = (bool)local_2d8.w._2_1_;
  opt_q.use_reserved_0 = (bool)local_2d8.w._3_1_;
  opt_q.use_shader_pack8 = (bool)(undefined1)local_2d8.dims;
  opt_q.use_subgroup_basic = (bool)local_2d8.dims._1_1_;
  opt_q.use_subgroup_vote = (bool)local_2d8.dims._2_1_;
  opt_q.use_subgroup_ballot = (bool)local_2d8.dims._3_1_;
  opt_q.use_local_pool_allocator = (bool)(undefined1)local_2d8.d;
  opt_q.use_shader_local_memory = (bool)local_2d8.d._1_1_;
  opt_q.use_cooperative_matrix = (bool)local_2d8.d._2_1_;
  opt_q.use_winograd23_convolution = (bool)local_2d8.d._3_1_;
  opt_q.flush_denormals = local_2d8.h;
  opt_q._32_8_ = local_2d8.allocator;
  opt_q._60_4_ = auVar11._28_4_;
  opt_q.use_winograd43_convolution = (bool)(undefined1)local_2d8.c;
  opt_q.use_winograd63_convolution = (bool)local_2d8.c._1_1_;
  opt_q.use_a53_a55_optimized_kernel = (bool)local_2d8.c._2_1_;
  opt_q.use_reserved_7 = (bool)local_2d8.c._3_1_;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  local_338 = uVar30 & 0xffffffff;
  uVar41 = local_338;
  uVar28 = uVar30;
  if ((int)uVar20 < iVar26) {
    _top_rescale = *(void **)opt;
    pAStack_258 = opt->workspace_allocator;
    iStack_250 = opt->openmp_blocktime;
    unique0x10005ee6 = opt->use_winograd_convolution;
    unique0x10005ee7 = opt->use_sgemm_convolution;
    unique0x10005ee8 = opt->use_int8_inference;
    unique0x10005ee9 = opt->use_vulkan_compute;
    local_248 = *(Allocator **)&opt->use_bf16_storage;
    _iStack_240 = *(undefined8 *)&opt->use_shader_pack8;
    _iStack_238 = *(undefined8 *)&opt->flush_denormals;
    _iStack_230 = *(undefined8 *)&opt->use_winograd43_convolution;
    pAStack_260 = opt->workspace_allocator;
    convert_packing(&local_2d8,(Mat *)&opt_q,uVar20,(Option *)&top_rescale);
    uVar28 = uVar30 & 0xffffffff;
  }
  piVar3 = top_blob->refcount;
  _top_rescale = top_blob->data;
  pAStack_260 = (Allocator *)top_blob->refcount;
  pAStack_258 = (Allocator *)top_blob->elemsize;
  iStack_250 = top_blob->elempack;
  local_248 = top_blob->allocator;
  iStack_240 = top_blob->dims;
  iStack_23c = top_blob->w;
  iStack_238 = top_blob->h;
  iStack_234 = top_blob->d;
  iStack_230 = top_blob->c;
  local_228 = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (uVar21 < _elempack) {
    local_300 = (byte)uVar17;
    local_310 = (byte)uVar48;
    Mat::create((Mat *)&top_rescale,iVar25,iVar38,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
                (int)uVar21,(ulong)((local_300 / local_310) * uVar21),uVar21,
                opt->workspace_allocator);
    uVar28 = uVar30 & 0xffffffff;
    iVar40 = -100;
    if ((_top_rescale != (void *)0x0) && ((long)iStack_230 * local_228 != 0)) goto LAB_003a6f3c;
  }
  else {
LAB_003a6f3c:
    iVar25 = 0;
    iVar43 = 0;
    for (lVar32 = 0; auVar11 = (undefined1  [32])opt_q._32_32_,
        lVar32 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
        lVar32 = lVar32 + 1) {
      local_178 = (int)uVar28 / (int)uVar20;
      _scale_out = (void *)((long)(iVar25 / (int)uVar20) * sVar9 * (long)opt_q.workspace_allocator +
                           opt_q._0_8_);
      local_1a8 = (int *)0x0;
      local_1a0 = opt_q.workspace_allocator;
      local_198 = opt_q.openmp_blocktime;
      local_190 = (long *)opt_q._32_8_;
      uVar10 = opt_q._40_8_;
      uVar12 = opt_q._48_8_;
      local_170 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                   (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_q.workspace_allocator;
      opt_q.use_shader_pack8 = SUB81(uVar10,0);
      opt_q.use_subgroup_basic = SUB81(uVar10,1);
      opt_q.use_subgroup_vote = SUB81(uVar10,2);
      opt_q.use_subgroup_ballot = SUB81(uVar10,3);
      opt_q.use_subgroup_shuffle = SUB81(uVar10,4);
      opt_q.use_image_storage = SUB81(uVar10,5);
      opt_q.use_tensor_storage = SUB81(uVar10,6);
      opt_q.use_reserved_0 = SUB81(uVar10,7);
      local_188 = opt_q.use_shader_pack8;
      bStack_187 = opt_q.use_subgroup_basic;
      bStack_186 = opt_q.use_subgroup_vote;
      bStack_185 = opt_q.use_subgroup_ballot;
      bStack_184 = opt_q.use_subgroup_shuffle;
      bStack_183 = opt_q.use_image_storage;
      bStack_182 = opt_q.use_tensor_storage;
      bStack_181 = opt_q.use_reserved_0;
      opt_q.flush_denormals = (int)uVar12;
      opt_q.use_local_pool_allocator = SUB81(uVar12,4);
      opt_q.use_shader_local_memory = SUB81(uVar12,5);
      opt_q.use_cooperative_matrix = SUB81(uVar12,6);
      opt_q.use_winograd23_convolution = SUB81(uVar12,7);
      iStack_180 = opt_q.flush_denormals;
      bStack_17c = opt_q.use_local_pool_allocator;
      bStack_17b = opt_q.use_shader_local_memory;
      bStack_17a = opt_q.use_cooperative_matrix;
      bStack_179 = opt_q.use_winograd23_convolution;
      m_1.data = (void *)((long)(iVar43 / (int)uVar21) * local_228 * (long)pAStack_258 +
                         (long)_top_rescale);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)pAStack_258;
      m_1.elempack = iStack_250;
      m_1.allocator = local_248;
      m_1.c = (int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff) /
                   (long)(int)uVar21);
      m_1.cstep = ((long)iStack_234 * (long)pAStack_258 * (long)iStack_238 * (long)iStack_23c + 0xfU
                  & 0xfffffffffffffff0) / (ulong)pAStack_258;
      m_1.dims = iStack_240;
      m_1.w = iStack_23c;
      m_1.h = iStack_238;
      m_1.d = iStack_234;
      pLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar32];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = local_248;
      opt_q._32_32_ = auVar11;
      (*pLVar5->_vptr_Layer[7])(pLVar5,&scale_out,&m_1,&opt_g);
      local_338._0_4_ = (int)uVar30;
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_1a8 != (int *)0x0) {
        LOCK();
        *local_1a8 = *local_1a8 + -1;
        UNLOCK();
        if (*local_1a8 == 0) {
          if (local_190 == (long *)0x0) {
            free(_scale_out);
          }
          else {
            (**(code **)(*local_190 + 0x18))();
          }
        }
      }
      iVar43 = iVar43 + (int)uVar46;
      iVar25 = iVar25 + (int)local_338;
      uVar28 = uVar41;
    }
    if (uVar21 < _elempack) {
      iVar40 = 0;
      convert_packing((Mat *)&top_rescale,top_blob,_elempack,opt);
    }
    else {
      iVar40 = 0;
      if ((Mat *)&top_rescale != top_blob) {
        if (pAStack_260 != (Allocator *)0x0) {
          LOCK();
          *(int *)&pAStack_260->_vptr_Allocator = *(int *)&pAStack_260->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = _top_rescale;
        top_blob->refcount = (int *)pAStack_260;
        top_blob->elemsize = (size_t)pAStack_258;
        top_blob->elempack = iStack_250;
        top_blob->allocator = local_248;
        top_blob->dims = iStack_240;
        top_blob->w = iStack_23c;
        top_blob->h = iStack_238;
        top_blob->d = iStack_234;
        top_blob->c = iStack_230;
        top_blob->cstep = local_228;
      }
    }
  }
  if (pAStack_260 != (Allocator *)0x0) {
    LOCK();
    *(int *)&pAStack_260->_vptr_Allocator = *(int *)&pAStack_260->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&pAStack_260->_vptr_Allocator == 0) {
      if (local_248 == (Allocator *)0x0) {
        free(_top_rescale);
      }
      else {
        (*local_248->_vptr_Allocator[3])();
      }
    }
  }
  if (opt_q.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_q._32_8_ == 0) {
        free((void *)opt_q._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
      }
    }
  }
LAB_003a83ef:
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_2d8.allocator == (Allocator *)0x0) {
        free(local_2d8.data);
      }
      else {
        (*(local_2d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}